

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O1

void PrintMetadataInfo(Metadata *metadata,int metadata_written)

{
  if (metadata_written == 0 || metadata == (Metadata *)0x0) {
    return;
  }
  PrintMetadataInfo_cold_1();
  return;
}

Assistant:

static void PrintMetadataInfo(const Metadata* const metadata,
                              int metadata_written) {
  if (metadata == NULL || metadata_written == 0) return;

  fprintf(stderr, "Metadata:\n");
  if (metadata_written & METADATA_ICC) {
    fprintf(stderr, "  * ICC profile:  %6d bytes\n", (int)metadata->iccp.size);
  }
  if (metadata_written & METADATA_EXIF) {
    fprintf(stderr, "  * EXIF data:    %6d bytes\n", (int)metadata->exif.size);
  }
  if (metadata_written & METADATA_XMP) {
    fprintf(stderr, "  * XMP data:     %6d bytes\n", (int)metadata->xmp.size);
  }
}